

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O0

bool SignStep(SigningProvider *provider,BaseSignatureCreator *creator,CScript *scriptPubKey,
             vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *ret,TxoutType *whichTypeRet,SigVersion sigversion,SignatureData *sigdata)

{
  Span<const_unsigned_char> _vch;
  Span<const_unsigned_char> vch;
  Span<const_unsigned_char> vch_00;
  Span<const_unsigned_char> _vch_00;
  Span<const_unsigned_char> vch_01;
  span<const_unsigned_char,_18446744073709551615UL> bytes;
  bool bVar1;
  TxoutType TVar2;
  BaseSignatureCreator *creator_00;
  byte *pbVar3;
  ulong uVar4;
  size_type sVar5;
  __extent_storage<18446744073709551615UL> in_RDI;
  TxoutType *in_R8;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  byte bVar6;
  long in_stack_00000008;
  size_t i_1;
  bool ok;
  size_t i;
  size_t required;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  vSolutions;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  CPubKey pubkey_1;
  uint160 h160;
  CPubKey pubkey;
  CKeyID keyID;
  CScript scriptRet;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbdc;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_fffffffffffffbe0;
  span<const_unsigned_char,_18446744073709551615UL> *in_stack_fffffffffffffbe8;
  undefined6 in_stack_fffffffffffffbf0;
  undefined1 in_stack_fffffffffffffbf6;
  undefined1 in_stack_fffffffffffffbf7;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_fffffffffffffbf8;
  CPubKey *in_stack_fffffffffffffc00;
  CKeyID *in_stack_fffffffffffffc08;
  SignatureData *in_stack_fffffffffffffc10;
  CPubKey *in_stack_fffffffffffffc18;
  undefined7 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2f;
  CPubKey *in_stack_fffffffffffffc30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffc38;
  SigningProvider *in_stack_fffffffffffffc40;
  SignatureData *in_stack_fffffffffffffc48;
  BaseSignatureCreator *in_stack_fffffffffffffc50;
  long lVar7;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_fffffffffffffcc8;
  SignatureData *in_stack_fffffffffffffcd0;
  WitnessV1Taproot *in_stack_fffffffffffffcd8;
  SigningProvider *provider_00;
  long local_308;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  CScript *in_stack_fffffffffffffd08;
  ulong uVar8;
  ulong uVar9;
  bool local_2a1;
  size_t local_270;
  uchar *local_268;
  SigVersion sigversion_00;
  undefined8 in_stack_fffffffffffffdb0;
  SigningProvider local_1f8 [14];
  undefined8 local_183;
  undefined8 local_17b;
  undefined8 local_173;
  undefined8 local_16b;
  uchar local_163 [125];
  undefined8 local_e6;
  undefined8 local_de;
  undefined4 local_d6;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CScript::CScript((CScript *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::clear((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  provider_00 = local_1f8;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  TVar2 = Solver(in_stack_fffffffffffffd08,
                 (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
  sigversion_00 = (SigVersion)in_stack_fffffffffffffdb0;
  *in_R8 = TVar2;
  creator_00 = (BaseSignatureCreator *)(ulong)*in_R8;
  switch(creator_00) {
  case (BaseSignatureCreator *)0x0:
  case (BaseSignatureCreator *)0x6:
  case (BaseSignatureCreator *)0xa:
    local_2a1 = false;
    break;
  case (BaseSignatureCreator *)0x1:
    local_2a1 = true;
    break;
  case (BaseSignatureCreator *)0x2:
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffbe8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe0,
               (type)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    _vch.m_data._6_1_ = in_stack_fffffffffffffbf6;
    _vch.m_data._0_6_ = in_stack_fffffffffffffbf0;
    _vch.m_data._7_1_ = in_stack_fffffffffffffbf7;
    _vch.m_size = (size_t)in_stack_fffffffffffffbf8;
    CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffbe8,_vch);
    bVar1 = CreateSig(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                      in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
                      (CScript *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28),
                      sigversion_00);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::push_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffbdc,in_R9D),(value_type *)0xf0b39d);
      local_2a1 = true;
      in_stack_fffffffffffffbd8 = in_R9D;
    }
    else {
      local_2a1 = false;
      in_stack_fffffffffffffbd8 = in_R9D;
    }
    break;
  case (BaseSignatureCreator *)0x3:
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffbe8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe0,
               (type)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    vch.m_data._6_1_ = in_stack_fffffffffffffbf6;
    vch.m_data._0_6_ = in_stack_fffffffffffffbf0;
    vch.m_data._7_1_ = in_stack_fffffffffffffbf7;
    vch.m_size = (size_t)in_stack_fffffffffffffbf8;
    uint160::uint160((uint160 *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),vch);
    CKeyID::CKeyID((CKeyID *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                   (uint160 *)0xf0b41e);
    CPubKey::CPubKey((CPubKey *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    bVar1 = GetPubKey((SigningProvider *)in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,
                      in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
    if (bVar1) {
      bVar1 = CreateSig(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                        in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                        in_stack_fffffffffffffc30,
                        (CScript *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28),
                        sigversion_00);
      if (bVar1) {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::push_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffbdc,in_R9D),(value_type *)0xf0b524);
        ToByteVector<CPubKey>(in_stack_fffffffffffffc18);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::push_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffbdc,in_R9D),(value_type *)0xf0b562);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffbe8);
        local_2a1 = true;
        in_stack_fffffffffffffbd8 = in_R9D;
      }
      else {
        local_2a1 = false;
        in_stack_fffffffffffffbd8 = in_R9D;
      }
    }
    else {
      std::vector<CKeyID,_std::allocator<CKeyID>_>::push_back
                ((vector<CKeyID,_std::allocator<CKeyID>_> *)in_stack_fffffffffffffbe8,
                 (value_type *)in_stack_fffffffffffffbe0);
      local_2a1 = false;
    }
    break;
  case (BaseSignatureCreator *)0x4:
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffbe8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe0,
               (type)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    vch_00.m_data._6_1_ = in_stack_fffffffffffffbf6;
    vch_00.m_data._0_6_ = in_stack_fffffffffffffbf0;
    vch_00.m_data._7_1_ = in_stack_fffffffffffffbf7;
    vch_00.m_size = (size_t)in_stack_fffffffffffffbf8;
    uint160::uint160((uint160 *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),vch_00
                    );
    CScriptID::CScriptID
              ((CScriptID *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
               (uint160 *)0xf0b63a);
    bVar1 = GetCScript((SigningProvider *)in_stack_fffffffffffffbf8,
                       (SignatureData *)
                       CONCAT17(in_stack_fffffffffffffbf7,
                                CONCAT16(in_stack_fffffffffffffbf6,in_stack_fffffffffffffbf0)),
                       (CScriptID *)in_stack_fffffffffffffbe8,(CScript *)in_stack_fffffffffffffbe0);
    if (bVar1) {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::begin(in_stack_fffffffffffffbe0);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::end(in_stack_fffffffffffffbe0);
      std::
      vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::
      emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
                (in_stack_fffffffffffffbf8,
                 (iterator *)
                 CONCAT17(in_stack_fffffffffffffbf7,
                          CONCAT16(in_stack_fffffffffffffbf6,in_stack_fffffffffffffbf0)),
                 (iterator *)in_stack_fffffffffffffbe8);
      local_2a1 = true;
    }
    else {
      *(undefined8 *)(in_stack_00000008 + 0x298) = local_e6;
      *(undefined8 *)(in_stack_00000008 + 0x2a0) = local_de;
      *(undefined4 *)(in_stack_00000008 + 0x2a8) = local_d6;
      local_2a1 = false;
    }
    break;
  case (BaseSignatureCreator *)0x5:
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::front((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)in_stack_fffffffffffffbe0);
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    uVar4 = (ulong)*pbVar3;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::emplace_back<>((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)in_stack_fffffffffffffbe8);
    uVar8 = 1;
    while (uVar9 = uVar8,
          sVar5 = std::
                  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)),
          uVar8 < sVar5 - 1) {
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
      Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<const_unsigned_char> *)in_stack_fffffffffffffbe8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe0,
                 (type)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      _vch_00.m_data._6_1_ = in_stack_fffffffffffffbf6;
      _vch_00.m_data._0_6_ = in_stack_fffffffffffffbf0;
      _vch_00.m_data._7_1_ = in_stack_fffffffffffffbf7;
      _vch_00.m_size = (size_t)in_stack_fffffffffffffbf8;
      CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffbe8,_vch_00);
      in_stack_fffffffffffffbd8 = in_R9D;
      bVar1 = CreateSig(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                        in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                        in_stack_fffffffffffffc30,
                        (CScript *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28),
                        (SigVersion)in_stack_fffffffffffffdb0);
      if ((bVar1) &&
         (sVar5 = std::
                  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)),
         sVar5 < uVar4 + 1)) {
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::push_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                    (value_type *)0xf0b8a2);
      }
      uVar8 = uVar9 + 1;
    }
    sVar5 = std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    bVar6 = sVar5 == uVar4 + 1;
    local_308 = 0;
    while (lVar7 = local_308,
          sVar5 = std::
                  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::size((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8)),
          lVar7 + sVar5 < uVar4 + 1) {
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::emplace_back<>((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)in_stack_fffffffffffffbe8);
      local_308 = local_308 + 1;
    }
    local_2a1 = (bool)(bVar6 & 1);
    break;
  case (BaseSignatureCreator *)0x7:
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffbe8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe0,
               (type)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    RIPEMD160(local_163,local_270,local_268);
    CScriptID::CScriptID
              ((CScriptID *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
               (uint160 *)0xf0ba34);
    bVar1 = GetCScript((SigningProvider *)in_stack_fffffffffffffbf8,
                       (SignatureData *)
                       CONCAT17(in_stack_fffffffffffffbf7,
                                CONCAT16(in_stack_fffffffffffffbf6,in_stack_fffffffffffffbf0)),
                       (CScriptID *)in_stack_fffffffffffffbe8,(CScript *)in_stack_fffffffffffffbe0);
    if (bVar1) {
      prevector<28U,_unsigned_char,_unsigned_int,_int>::begin(in_stack_fffffffffffffbe0);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::end(in_stack_fffffffffffffbe0);
      std::
      vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
      ::
      emplace_back<prevector<28u,unsigned_char,unsigned_int,int>::iterator,prevector<28u,unsigned_char,unsigned_int,int>::iterator>
                (in_stack_fffffffffffffbf8,
                 (iterator *)
                 CONCAT17(in_stack_fffffffffffffbf7,
                          CONCAT16(in_stack_fffffffffffffbf6,in_stack_fffffffffffffbf0)),
                 (iterator *)in_stack_fffffffffffffbe8);
      local_2a1 = true;
    }
    else {
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
      Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<const_unsigned_char> *)in_stack_fffffffffffffbe8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe0,
                 (type)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      vch_01.m_data._6_1_ = in_stack_fffffffffffffbf6;
      vch_01.m_data._0_6_ = in_stack_fffffffffffffbf0;
      vch_01.m_data._7_1_ = in_stack_fffffffffffffbf7;
      vch_01.m_size = (size_t)in_stack_fffffffffffffbf8;
      uint256::uint256((uint256 *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                       vch_01);
      *(undefined8 *)(in_stack_00000008 + 0x2ac) = local_183;
      *(undefined8 *)(in_stack_00000008 + 0x2b4) = local_17b;
      *(undefined8 *)(in_stack_00000008 + 700) = local_173;
      *(undefined8 *)(in_stack_00000008 + 0x2c4) = local_16b;
      local_2a1 = false;
    }
    break;
  case (BaseSignatureCreator *)0x8:
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::push_back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)in_stack_fffffffffffffbe8,(value_type *)in_stack_fffffffffffffbe0);
    local_2a1 = true;
    break;
  case (BaseSignatureCreator *)0x9:
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)in_stack_fffffffffffffbe8,(size_type)in_stack_fffffffffffffbe0);
    std::span<const_unsigned_char,_18446744073709551615UL>::
    span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
              (in_stack_fffffffffffffbe8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe0);
    bytes._M_ptr._6_1_ = in_stack_fffffffffffffbf6;
    bytes._M_ptr._0_6_ = in_stack_fffffffffffffbf0;
    bytes._M_ptr._7_1_ = in_stack_fffffffffffffbf7;
    bytes._M_extent._M_extent_value = in_RDI._M_extent_value;
    XOnlyPubKey::XOnlyPubKey
              ((XOnlyPubKey *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),bytes);
    WitnessV1Taproot::WitnessV1Taproot
              ((WitnessV1Taproot *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
               (XOnlyPubKey *)0xf0bc02);
    local_2a1 = SignTaproot(provider_00,creator_00,in_stack_fffffffffffffcd8,
                            in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/sign.cpp"
                  ,0x1e2,
                  "bool SignStep(const SigningProvider &, const BaseSignatureCreator &, const CScript &, std::vector<valtype> &, TxoutType &, SigVersion, SignatureData &)"
                 );
  }
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)in_stack_fffffffffffffbe8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffbe8);
  CScript::~CScript((CScript *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_2a1;
}

Assistant:

static bool SignStep(const SigningProvider& provider, const BaseSignatureCreator& creator, const CScript& scriptPubKey,
                     std::vector<valtype>& ret, TxoutType& whichTypeRet, SigVersion sigversion, SignatureData& sigdata)
{
    CScript scriptRet;
    ret.clear();
    std::vector<unsigned char> sig;

    std::vector<valtype> vSolutions;
    whichTypeRet = Solver(scriptPubKey, vSolutions);

    switch (whichTypeRet) {
    case TxoutType::NONSTANDARD:
    case TxoutType::NULL_DATA:
    case TxoutType::WITNESS_UNKNOWN:
        return false;
    case TxoutType::PUBKEY:
        if (!CreateSig(creator, sigdata, provider, sig, CPubKey(vSolutions[0]), scriptPubKey, sigversion)) return false;
        ret.push_back(std::move(sig));
        return true;
    case TxoutType::PUBKEYHASH: {
        CKeyID keyID = CKeyID(uint160(vSolutions[0]));
        CPubKey pubkey;
        if (!GetPubKey(provider, sigdata, keyID, pubkey)) {
            // Pubkey could not be found, add to missing
            sigdata.missing_pubkeys.push_back(keyID);
            return false;
        }
        if (!CreateSig(creator, sigdata, provider, sig, pubkey, scriptPubKey, sigversion)) return false;
        ret.push_back(std::move(sig));
        ret.push_back(ToByteVector(pubkey));
        return true;
    }
    case TxoutType::SCRIPTHASH: {
        uint160 h160{vSolutions[0]};
        if (GetCScript(provider, sigdata, CScriptID{h160}, scriptRet)) {
            ret.emplace_back(scriptRet.begin(), scriptRet.end());
            return true;
        }
        // Could not find redeemScript, add to missing
        sigdata.missing_redeem_script = h160;
        return false;
    }
    case TxoutType::MULTISIG: {
        size_t required = vSolutions.front()[0];
        ret.emplace_back(); // workaround CHECKMULTISIG bug
        for (size_t i = 1; i < vSolutions.size() - 1; ++i) {
            CPubKey pubkey = CPubKey(vSolutions[i]);
            // We need to always call CreateSig in order to fill sigdata with all
            // possible signatures that we can create. This will allow further PSBT
            // processing to work as it needs all possible signature and pubkey pairs
            if (CreateSig(creator, sigdata, provider, sig, pubkey, scriptPubKey, sigversion)) {
                if (ret.size() < required + 1) {
                    ret.push_back(std::move(sig));
                }
            }
        }
        bool ok = ret.size() == required + 1;
        for (size_t i = 0; i + ret.size() < required + 1; ++i) {
            ret.emplace_back();
        }
        return ok;
    }
    case TxoutType::WITNESS_V0_KEYHASH:
        ret.push_back(vSolutions[0]);
        return true;

    case TxoutType::WITNESS_V0_SCRIPTHASH:
        if (GetCScript(provider, sigdata, CScriptID{RIPEMD160(vSolutions[0])}, scriptRet)) {
            ret.emplace_back(scriptRet.begin(), scriptRet.end());
            return true;
        }
        // Could not find witnessScript, add to missing
        sigdata.missing_witness_script = uint256(vSolutions[0]);
        return false;

    case TxoutType::WITNESS_V1_TAPROOT:
        return SignTaproot(provider, creator, WitnessV1Taproot(XOnlyPubKey{vSolutions[0]}), sigdata, ret);

    case TxoutType::ANCHOR:
        return true;
    } // no default case, so the compiler can warn about missing cases
    assert(false);
}